

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

void Sbd_StoFree(Sbd_Sto_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Mem_t *pVVar1;
  word *__ptr_01;
  Vec_Int_t *__ptr_02;
  long lVar2;
  int i;
  long lVar3;
  
  Vec_IntFree(p->vDelays);
  Vec_IntFree(p->vLevels);
  Vec_IntFree(p->vRefs);
  __ptr = p->vCuts;
  __ptr_02 = __ptr->pArray;
  lVar3 = 8;
  for (lVar2 = 0; lVar2 < __ptr->nCap; lVar2 = lVar2 + 1) {
    __ptr_00 = *(void **)((long)&__ptr_02->nCap + lVar3);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
      __ptr_02 = __ptr->pArray;
      *(undefined8 *)((long)&__ptr_02->nCap + lVar3) = 0;
    }
    lVar3 = lVar3 + 0x10;
  }
  free(__ptr_02);
  free(__ptr);
  if (p->fCutMin != 0) {
    pVVar1 = p->vTtMem;
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      Vec_IntFreeP(&pVVar1->vTable);
      Vec_IntFreeP(&pVVar1->vNexts);
      if (p->fCutMin == 0) goto LAB_00459dd4;
    }
    pVVar1 = p->vTtMem;
    for (lVar3 = 0; lVar3 <= pVVar1->iPage; lVar3 = lVar3 + 1) {
      __ptr_01 = pVVar1->ppPages[lVar3];
      if (__ptr_01 != (word *)0x0) {
        free(__ptr_01);
        pVVar1->ppPages[lVar3] = (word *)0x0;
      }
    }
    free(pVVar1->ppPages);
    free(pVVar1);
  }
LAB_00459dd4:
  free(p);
  return;
}

Assistant:

void Sbd_StoFree( Sbd_Sto_t * p )
{
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vLevels );
    Vec_IntFree( p->vRefs );
    Vec_WecFree( p->vCuts );
    if ( p->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}